

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_tests.cpp
# Opt level: O1

void __thiscall
sync_tests::inconsistent_lock_order_detected::test_method(inconsistent_lock_order_detected *this)

{
  long in_FS_OFFSET;
  Mutex mutex2;
  Mutex mutex1;
  RecursiveMutex rmutex2;
  RecursiveMutex rmutex1;
  __native_type local_d8;
  __native_type local_a8;
  __native_type local_78;
  __native_type local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_48.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_48.__align = 0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 1;
  local_78.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_78.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_78.__align = 0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 1;
  (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)&local_48.__data,
             (AnnotatedMixin<std::recursive_mutex> *)&local_78.__data);
  (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)&local_48.__data,
             (AnnotatedMixin<std::recursive_mutex> *)&local_78.__data);
  local_a8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_a8._16_8_ = 0;
  local_a8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_a8.__align = 0;
  local_a8._8_8_ = 0;
  local_d8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_d8._16_8_ = 0;
  local_d8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_d8.__align = 0;
  local_d8._8_8_ = 0;
  (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::mutex>>
            ((AnnotatedMixin<std::mutex> *)&local_a8.__data,
             (AnnotatedMixin<std::mutex> *)&local_d8.__data);
  (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::mutex>>
            ((AnnotatedMixin<std::mutex> *)&local_a8.__data,
             (AnnotatedMixin<std::mutex> *)&local_d8.__data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(inconsistent_lock_order_detected)
{
#ifdef DEBUG_LOCKORDER
    bool prev = g_debug_lockorder_abort;
    g_debug_lockorder_abort = false;
#endif // DEBUG_LOCKORDER

    RecursiveMutex rmutex1, rmutex2;
    TestInconsistentLockOrderDetected(rmutex1, rmutex2);
    // By checking lock order consistency (CheckLastCritical) before any unlocking (LeaveCritical)
    // the lock tracking data must not have been broken by exception.
    TestInconsistentLockOrderDetected(rmutex1, rmutex2);

    Mutex mutex1, mutex2;
    TestInconsistentLockOrderDetected(mutex1, mutex2);
    // By checking lock order consistency (CheckLastCritical) before any unlocking (LeaveCritical)
    // the lock tracking data must not have been broken by exception.
    TestInconsistentLockOrderDetected(mutex1, mutex2);

#ifdef DEBUG_LOCKORDER
    g_debug_lockorder_abort = prev;
#endif // DEBUG_LOCKORDER
}